

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O3

void __thiscall despot::util::tinyxml::TiXmlElement::Print(TiXmlElement *this,FILE *cfile,int depth)

{
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int iVar1;
  TiXmlAttribute *pTVar2;
  TiXmlNode *pTVar3;
  
  if (cfile == (FILE *)0x0) {
    __assert_fail("cfile",
                  "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxml.cpp"
                  ,0x288,
                  "virtual void despot::util::tinyxml::TiXmlElement::Print(FILE *, int) const");
  }
  iVar1 = depth;
  if (0 < depth) {
    do {
      fwrite("    ",4,1,(FILE *)cfile);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  fprintf((FILE *)cfile,"<%s",((this->super_TiXmlNode).value.rep_)->str);
  pTVar2 = (this->attributeSet).sentinel.next;
  if (pTVar2 != (TiXmlAttribute *)0x0 && pTVar2 != &(this->attributeSet).sentinel) {
    do {
      do {
        fputc(0x20,(FILE *)cfile);
        (*(pTVar2->super_TiXmlBase)._vptr_TiXmlBase[2])(pTVar2,cfile,(ulong)(uint)depth);
        pTVar2 = pTVar2->next;
      } while (((pTVar2->value).rep_)->size != 0);
    } while (((pTVar2->name).rep_)->size != 0);
  }
  pTVar3 = (this->super_TiXmlNode).firstChild;
  if (pTVar3 != (TiXmlNode *)0x0) {
    if ((pTVar3 == (this->super_TiXmlNode).lastChild) &&
       (iVar1 = (*(pTVar3->super_TiXmlBase)._vptr_TiXmlBase[0xe])(),
       CONCAT44(extraout_var_00,iVar1) != 0)) {
      fputc(0x3e,(FILE *)cfile);
      pTVar3 = (this->super_TiXmlNode).firstChild;
      (*(pTVar3->super_TiXmlBase)._vptr_TiXmlBase[2])(pTVar3,cfile,(ulong)(depth + 1));
    }
    else {
      fputc(0x3e,(FILE *)cfile);
      pTVar3 = (this->super_TiXmlNode).firstChild;
      if (pTVar3 != (TiXmlNode *)0x0) {
        do {
          iVar1 = (*(pTVar3->super_TiXmlBase)._vptr_TiXmlBase[0xe])(pTVar3);
          if (CONCAT44(extraout_var,iVar1) == 0) {
            fputc(10,(FILE *)cfile);
          }
          (*(pTVar3->super_TiXmlBase)._vptr_TiXmlBase[2])(pTVar3,cfile,(ulong)(depth + 1));
          pTVar3 = pTVar3->next;
        } while (pTVar3 != (TiXmlNode *)0x0);
      }
      fputc(10,(FILE *)cfile);
      if (0 < depth) {
        do {
          fwrite("    ",4,1,(FILE *)cfile);
          depth = depth + -1;
        } while (depth != 0);
      }
    }
    fprintf((FILE *)cfile,"</%s>",((this->super_TiXmlNode).value.rep_)->str);
    return;
  }
  fwrite(" />",3,1,(FILE *)cfile);
  return;
}

Assistant:

void TiXmlElement::Print(FILE* cfile, int depth) const {
	int i;
	assert(cfile);
	for (i = 0; i < depth; i++) {
		fprintf(cfile, "    ");
	}

	fprintf(cfile, "<%s", value.c_str());

	const TiXmlAttribute* attrib;
	for (attrib = attributeSet.First(); attrib; attrib = attrib->Next()) {
		fprintf(cfile, " ");
		attrib->Print(cfile, depth);
	}

	// There are 3 different formatting approaches:
	// 1) An element without children is printed as a <foo /> node
	// 2) An element with only a text child is printed as <foo> text </foo>
	// 3) An element with children is printed on multiple lines.
	TiXmlNode* node;
	if (!firstChild) {
		fprintf(cfile, " />");
	} else if (firstChild == lastChild && firstChild->ToText()) {
		fprintf(cfile, ">");
		firstChild->Print(cfile, depth + 1);
		fprintf(cfile, "</%s>", value.c_str());
	} else {
		fprintf(cfile, ">");

		for (node = firstChild; node; node = node->NextSibling()) {
			if (!node->ToText()) {
				fprintf(cfile, "\n");
			}
			node->Print(cfile, depth + 1);
		}
		fprintf(cfile, "\n");
		for (i = 0; i < depth; ++i) {
			fprintf(cfile, "    ");
		}
		fprintf(cfile, "</%s>", value.c_str());
	}
}